

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpret(StackInterpreter *this)

{
  size_t sVar1;
  int iVar2;
  
  this->extendA = 0;
  this->extendB = 0;
LAB_0015012f:
  sVar1 = this->pc;
  if (sVar1 == 0) {
    return;
  }
  this->currentOpcode = this->nextOpcode;
  switch(this->nextOpcode) {
  case 0:
    interpretPushReceiverVariableShort(this,0);
    goto LAB_0015012f;
  case 1:
    iVar2 = 1;
    goto LAB_00150a99;
  case 2:
    iVar2 = 2;
    goto LAB_00150a99;
  case 3:
    iVar2 = 3;
    goto LAB_00150a99;
  case 4:
    iVar2 = 4;
    goto LAB_00150a99;
  case 5:
    iVar2 = 5;
    goto LAB_00150a99;
  case 6:
    iVar2 = 6;
    goto LAB_00150a99;
  case 7:
    iVar2 = 7;
    goto LAB_00150a99;
  case 8:
    iVar2 = 8;
    goto LAB_00150a99;
  case 9:
    iVar2 = 9;
    goto LAB_00150a99;
  case 10:
    iVar2 = 10;
    goto LAB_00150a99;
  case 0xb:
    iVar2 = 0xb;
    goto LAB_00150a99;
  case 0xc:
    iVar2 = 0xc;
    goto LAB_00150a99;
  case 0xd:
    iVar2 = 0xd;
    goto LAB_00150a99;
  case 0xe:
    iVar2 = 0xe;
    goto LAB_00150a99;
  case 0xf:
    iVar2 = 0xf;
LAB_00150a99:
    interpretPushReceiverVariableShort(this,iVar2);
    goto LAB_0015012f;
  case 0x10:
    interpretPushLiteralVariableShort(this,0);
    goto LAB_0015012f;
  case 0x11:
    iVar2 = 1;
    goto LAB_00150aa9;
  case 0x12:
    iVar2 = 2;
    goto LAB_00150aa9;
  case 0x13:
    iVar2 = 3;
    goto LAB_00150aa9;
  case 0x14:
    iVar2 = 4;
    goto LAB_00150aa9;
  case 0x15:
    iVar2 = 5;
    goto LAB_00150aa9;
  case 0x16:
    iVar2 = 6;
    goto LAB_00150aa9;
  case 0x17:
    iVar2 = 7;
    goto LAB_00150aa9;
  case 0x18:
    iVar2 = 8;
    goto LAB_00150aa9;
  case 0x19:
    iVar2 = 9;
    goto LAB_00150aa9;
  case 0x1a:
    iVar2 = 10;
    goto LAB_00150aa9;
  case 0x1b:
    iVar2 = 0xb;
    goto LAB_00150aa9;
  case 0x1c:
    iVar2 = 0xc;
    goto LAB_00150aa9;
  case 0x1d:
    iVar2 = 0xd;
    goto LAB_00150aa9;
  case 0x1e:
    iVar2 = 0xe;
    goto LAB_00150aa9;
  case 0x1f:
    iVar2 = 0xf;
LAB_00150aa9:
    interpretPushLiteralVariableShort(this,iVar2);
    goto LAB_0015012f;
  case 0x20:
    interpretPushLiteralShort(this,0);
    goto LAB_0015012f;
  case 0x21:
    iVar2 = 1;
    break;
  case 0x22:
    iVar2 = 2;
    break;
  case 0x23:
    iVar2 = 3;
    break;
  case 0x24:
    iVar2 = 4;
    break;
  case 0x25:
    iVar2 = 5;
    break;
  case 0x26:
    iVar2 = 6;
    break;
  case 0x27:
    iVar2 = 7;
    break;
  case 0x28:
    iVar2 = 8;
    break;
  case 0x29:
    iVar2 = 9;
    break;
  case 0x2a:
    iVar2 = 10;
    break;
  case 0x2b:
    iVar2 = 0xb;
    break;
  case 0x2c:
    iVar2 = 0xc;
    break;
  case 0x2d:
    iVar2 = 0xd;
    break;
  case 0x2e:
    iVar2 = 0xe;
    break;
  case 0x2f:
    iVar2 = 0xf;
    break;
  case 0x30:
    iVar2 = 0x10;
    break;
  case 0x31:
    iVar2 = 0x11;
    break;
  case 0x32:
    iVar2 = 0x12;
    break;
  case 0x33:
    iVar2 = 0x13;
    break;
  case 0x34:
    iVar2 = 0x14;
    break;
  case 0x35:
    iVar2 = 0x15;
    break;
  case 0x36:
    iVar2 = 0x16;
    break;
  case 0x37:
    iVar2 = 0x17;
    break;
  case 0x38:
    iVar2 = 0x18;
    break;
  case 0x39:
    iVar2 = 0x19;
    break;
  case 0x3a:
    iVar2 = 0x1a;
    break;
  case 0x3b:
    iVar2 = 0x1b;
    break;
  case 0x3c:
    iVar2 = 0x1c;
    break;
  case 0x3d:
    iVar2 = 0x1d;
    break;
  case 0x3e:
    iVar2 = 0x1e;
    break;
  case 0x3f:
    iVar2 = 0x1f;
    break;
  case 0x40:
    interpretPushTempShort(this,0);
    goto LAB_0015012f;
  case 0x41:
    iVar2 = 1;
    goto LAB_00150a4b;
  case 0x42:
    iVar2 = 2;
    goto LAB_00150a4b;
  case 0x43:
    iVar2 = 3;
    goto LAB_00150a4b;
  case 0x44:
    iVar2 = 4;
    goto LAB_00150a4b;
  case 0x45:
    iVar2 = 5;
    goto LAB_00150a4b;
  case 0x46:
    iVar2 = 6;
    goto LAB_00150a4b;
  case 0x47:
    iVar2 = 7;
    goto LAB_00150a4b;
  case 0x48:
    iVar2 = 8;
    goto LAB_00150a4b;
  case 0x49:
    iVar2 = 9;
    goto LAB_00150a4b;
  case 0x4a:
    iVar2 = 10;
    goto LAB_00150a4b;
  case 0x4b:
    iVar2 = 0xb;
LAB_00150a4b:
    interpretPushTempShort(this,iVar2);
    goto LAB_0015012f;
  case 0x4c:
    interpretPushReceiver(this);
    goto LAB_0015012f;
  case 0x4d:
    interpretPushTrue(this);
    goto LAB_0015012f;
  case 0x4e:
    interpretPushFalse(this);
    goto LAB_0015012f;
  case 0x4f:
    interpretPushNil(this);
    goto LAB_0015012f;
  case 0x50:
    interpretPushZero(this);
    goto LAB_0015012f;
  case 0x51:
    interpretPushOne(this);
    goto LAB_0015012f;
  case 0x52:
    interpretPushThisContext(this);
    goto LAB_0015012f;
  case 0x53:
    interpretDuplicateStackTop(this);
    goto LAB_0015012f;
  default:
    errorFormat(this,"unsupported bytecode %d");
    goto LAB_0015012f;
  case 0x58:
    returnReceiver(this);
    goto LAB_0015012f;
  case 0x59:
    interpretReturnTrue(this);
    goto LAB_0015012f;
  case 0x5a:
    interpretReturnFalse(this);
    goto LAB_0015012f;
  case 0x5b:
    interpretReturnNil(this);
    goto LAB_0015012f;
  case 0x5c:
    returnTop(this);
    goto LAB_0015012f;
  case 0x5d:
    interpretBlockReturnNil(this);
    goto LAB_0015012f;
  case 0x5e:
    interpretBlockReturnTop(this);
    goto LAB_0015012f;
  case 0x5f:
    this->pc = sVar1 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1);
    goto LAB_0015012f;
  case 0x60:
    interpretSpecialMessageAdd(this);
    goto LAB_0015012f;
  case 0x61:
    interpretSpecialMessageMinus(this);
    goto LAB_0015012f;
  case 0x62:
    interpretSpecialMessageLessThan(this);
    goto LAB_0015012f;
  case 99:
    interpretSpecialMessageGreaterThan(this);
    goto LAB_0015012f;
  case 100:
    interpretSpecialMessageLessEqual(this);
    goto LAB_0015012f;
  case 0x65:
    interpretSpecialMessageGreaterEqual(this);
    goto LAB_0015012f;
  case 0x66:
    interpretSpecialMessageEqual(this);
    goto LAB_0015012f;
  case 0x67:
    interpretSpecialMessageNotEqual(this);
    goto LAB_0015012f;
  case 0x68:
    interpretSpecialMessageMultiply(this);
    goto LAB_0015012f;
  case 0x69:
    interpretSpecialMessageDivide(this);
    goto LAB_0015012f;
  case 0x6a:
    interpretSpecialMessageRemainder(this);
    goto LAB_0015012f;
  case 0x6b:
    interpretSpecialMessageMakePoint(this);
    goto LAB_0015012f;
  case 0x6c:
    interpretSpecialMessageBitShift(this);
    goto LAB_0015012f;
  case 0x6d:
    interpretSpecialMessageIntegerDivision(this);
    goto LAB_0015012f;
  case 0x6e:
    interpretSpecialMessageBitAnd(this);
    goto LAB_0015012f;
  case 0x6f:
    interpretSpecialMessageBitOr(this);
    goto LAB_0015012f;
  case 0x70:
    interpretSpecialMessageAt(this);
    goto LAB_0015012f;
  case 0x71:
    interpretSpecialMessageAtPut(this);
    goto LAB_0015012f;
  case 0x72:
    interpretSpecialMessageSize(this);
    goto LAB_0015012f;
  case 0x73:
    interpretSpecialMessageNext(this);
    goto LAB_0015012f;
  case 0x74:
    interpretSpecialMessageNextPut(this);
    goto LAB_0015012f;
  case 0x75:
    interpretSpecialMessageAtEnd(this);
    goto LAB_0015012f;
  case 0x76:
    interpretSpecialMessageIdentityEqual(this);
    goto LAB_0015012f;
  case 0x77:
    interpretSpecialMessageClass(this);
    goto LAB_0015012f;
  case 0x79:
    interpretSpecialMessageValue(this);
    goto LAB_0015012f;
  case 0x7a:
    interpretSpecialMessageValueArg(this);
    goto LAB_0015012f;
  case 0x7b:
    interpretSpecialMessageDo(this);
    goto LAB_0015012f;
  case 0x7c:
    interpretSpecialMessageNew(this);
    goto LAB_0015012f;
  case 0x7d:
    interpretSpecialMessageNewArray(this);
    goto LAB_0015012f;
  case 0x7e:
    interpretSpecialMessageX(this);
    goto LAB_0015012f;
  case 0x7f:
    interpretSpecialMessageY(this);
    goto LAB_0015012f;
  case 0x80:
    interpretSendShortArgs0(this,0);
    goto LAB_0015012f;
  case 0x81:
    iVar2 = 1;
    goto LAB_00150987;
  case 0x82:
    iVar2 = 2;
    goto LAB_00150987;
  case 0x83:
    iVar2 = 3;
    goto LAB_00150987;
  case 0x84:
    iVar2 = 4;
    goto LAB_00150987;
  case 0x85:
    iVar2 = 5;
    goto LAB_00150987;
  case 0x86:
    iVar2 = 6;
    goto LAB_00150987;
  case 0x87:
    iVar2 = 7;
    goto LAB_00150987;
  case 0x88:
    iVar2 = 8;
    goto LAB_00150987;
  case 0x89:
    iVar2 = 9;
    goto LAB_00150987;
  case 0x8a:
    iVar2 = 10;
    goto LAB_00150987;
  case 0x8b:
    iVar2 = 0xb;
    goto LAB_00150987;
  case 0x8c:
    iVar2 = 0xc;
    goto LAB_00150987;
  case 0x8d:
    iVar2 = 0xd;
    goto LAB_00150987;
  case 0x8e:
    iVar2 = 0xe;
    goto LAB_00150987;
  case 0x8f:
    iVar2 = 0xf;
LAB_00150987:
    interpretSendShortArgs0(this,iVar2);
    goto LAB_0015012f;
  case 0x90:
    interpretSendShortArgs1(this,0);
    goto LAB_0015012f;
  case 0x91:
    iVar2 = 1;
    goto LAB_001509ef;
  case 0x92:
    iVar2 = 2;
    goto LAB_001509ef;
  case 0x93:
    iVar2 = 3;
    goto LAB_001509ef;
  case 0x94:
    iVar2 = 4;
    goto LAB_001509ef;
  case 0x95:
    iVar2 = 5;
    goto LAB_001509ef;
  case 0x96:
    iVar2 = 6;
    goto LAB_001509ef;
  case 0x97:
    iVar2 = 7;
    goto LAB_001509ef;
  case 0x98:
    iVar2 = 8;
    goto LAB_001509ef;
  case 0x99:
    iVar2 = 9;
    goto LAB_001509ef;
  case 0x9a:
    iVar2 = 10;
    goto LAB_001509ef;
  case 0x9b:
    iVar2 = 0xb;
    goto LAB_001509ef;
  case 0x9c:
    iVar2 = 0xc;
    goto LAB_001509ef;
  case 0x9d:
    iVar2 = 0xd;
    goto LAB_001509ef;
  case 0x9e:
    iVar2 = 0xe;
    goto LAB_001509ef;
  case 0x9f:
    iVar2 = 0xf;
LAB_001509ef:
    interpretSendShortArgs1(this,iVar2);
    goto LAB_0015012f;
  case 0xa0:
    interpretSendShortArgs2(this,0);
    goto LAB_0015012f;
  case 0xa1:
    iVar2 = 1;
    goto LAB_00150966;
  case 0xa2:
    iVar2 = 2;
    goto LAB_00150966;
  case 0xa3:
    iVar2 = 3;
    goto LAB_00150966;
  case 0xa4:
    iVar2 = 4;
    goto LAB_00150966;
  case 0xa5:
    iVar2 = 5;
    goto LAB_00150966;
  case 0xa6:
    iVar2 = 6;
    goto LAB_00150966;
  case 0xa7:
    iVar2 = 7;
    goto LAB_00150966;
  case 0xa8:
    iVar2 = 8;
    goto LAB_00150966;
  case 0xa9:
    iVar2 = 9;
    goto LAB_00150966;
  case 0xaa:
    iVar2 = 10;
    goto LAB_00150966;
  case 0xab:
    iVar2 = 0xb;
    goto LAB_00150966;
  case 0xac:
    iVar2 = 0xc;
    goto LAB_00150966;
  case 0xad:
    iVar2 = 0xd;
    goto LAB_00150966;
  case 0xae:
    iVar2 = 0xe;
    goto LAB_00150966;
  case 0xaf:
    iVar2 = 0xf;
LAB_00150966:
    interpretSendShortArgs2(this,iVar2);
    goto LAB_0015012f;
  case 0xb0:
    this->pc = sVar1 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 1);
    goto LAB_0015012f;
  case 0xb1:
    this->pc = sVar1 + 3;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 2);
    goto LAB_0015012f;
  case 0xb2:
    this->pc = sVar1 + 4;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 3);
    goto LAB_0015012f;
  case 0xb3:
    this->pc = sVar1 + 5;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 4);
    goto LAB_0015012f;
  case 0xb4:
    this->pc = sVar1 + 6;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 5);
    goto LAB_0015012f;
  case 0xb5:
    this->pc = sVar1 + 7;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 6);
    goto LAB_0015012f;
  case 0xb6:
    this->pc = sVar1 + 8;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1 + 7);
    goto LAB_0015012f;
  case 0xb7:
    this->pc = sVar1 + 9;
    this->nextOpcode =
         (uint)*(byte *)((long)&this->method[1].super_ByteArray.super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar1);
    goto LAB_0015012f;
  case 0xb8:
    interpretJumpOnTrueShort(this,0);
    goto LAB_0015012f;
  case 0xb9:
    iVar2 = 1;
    goto LAB_001508e8;
  case 0xba:
    iVar2 = 2;
    goto LAB_001508e8;
  case 0xbb:
    iVar2 = 3;
    goto LAB_001508e8;
  case 0xbc:
    iVar2 = 4;
    goto LAB_001508e8;
  case 0xbd:
    iVar2 = 5;
    goto LAB_001508e8;
  case 0xbe:
    iVar2 = 6;
    goto LAB_001508e8;
  case 0xbf:
    iVar2 = 7;
LAB_001508e8:
    interpretJumpOnTrueShort(this,iVar2);
    goto LAB_0015012f;
  case 0xc0:
    interpretJumpOnFalseShort(this,0);
    goto LAB_0015012f;
  case 0xc1:
    iVar2 = 1;
    goto LAB_001508f8;
  case 0xc2:
    iVar2 = 2;
    goto LAB_001508f8;
  case 0xc3:
    iVar2 = 3;
    goto LAB_001508f8;
  case 0xc4:
    iVar2 = 4;
    goto LAB_001508f8;
  case 0xc5:
    iVar2 = 5;
    goto LAB_001508f8;
  case 0xc6:
    iVar2 = 6;
    goto LAB_001508f8;
  case 199:
    iVar2 = 7;
LAB_001508f8:
    interpretJumpOnFalseShort(this,iVar2);
    goto LAB_0015012f;
  case 200:
    interpretPopStoreReceiverVariableShort(this,0);
    goto LAB_0015012f;
  case 0xc9:
    iVar2 = 1;
    goto LAB_0015086b;
  case 0xca:
    iVar2 = 2;
    goto LAB_0015086b;
  case 0xcb:
    iVar2 = 3;
    goto LAB_0015086b;
  case 0xcc:
    iVar2 = 4;
    goto LAB_0015086b;
  case 0xcd:
    iVar2 = 5;
    goto LAB_0015086b;
  case 0xce:
    iVar2 = 6;
    goto LAB_0015086b;
  case 0xcf:
    iVar2 = 7;
LAB_0015086b:
    interpretPopStoreReceiverVariableShort(this,iVar2);
    goto LAB_0015012f;
  case 0xd0:
    interpretPopStoreTemporalVariableShort(this,0);
    goto LAB_0015012f;
  case 0xd1:
    iVar2 = 1;
    goto LAB_00150840;
  case 0xd2:
    iVar2 = 2;
    goto LAB_00150840;
  case 0xd3:
    iVar2 = 3;
    goto LAB_00150840;
  case 0xd4:
    iVar2 = 4;
    goto LAB_00150840;
  case 0xd5:
    iVar2 = 5;
    goto LAB_00150840;
  case 0xd6:
    iVar2 = 6;
    goto LAB_00150840;
  case 0xd7:
    iVar2 = 7;
LAB_00150840:
    interpretPopStoreTemporalVariableShort(this,iVar2);
    goto LAB_0015012f;
  case 0xd8:
    interpretPopStackTop(this);
    goto LAB_0015012f;
  case 0xe0:
    interpretExtendA(this);
    goto LAB_0015012f;
  case 0xe1:
    interpretExtendB(this);
    goto LAB_0015012f;
  case 0xe2:
    interpretPushReceiverVariable(this);
    goto LAB_0015012f;
  case 0xe3:
    interpretPushLiteralVariable(this);
    goto LAB_0015012f;
  case 0xe4:
    interpretPushLiteral(this);
    goto LAB_0015012f;
  case 0xe5:
    interpretPushTemporary(this);
    goto LAB_0015012f;
  case 0xe6:
    interpretPushNTemps(this);
    goto LAB_0015012f;
  case 0xe7:
    interpretPushInteger(this);
    goto LAB_0015012f;
  case 0xe8:
    interpretPushCharacter(this);
    goto LAB_0015012f;
  case 0xe9:
    interpretPushArrayWithElements(this);
    goto LAB_0015012f;
  case 0xea:
    interpretSend(this);
    goto LAB_0015012f;
  case 0xeb:
    interpretSuperSend(this);
    goto LAB_0015012f;
  case 0xec:
    interpretTrapOnBehavior(this);
    goto LAB_0015012f;
  case 0xed:
    interpretJump(this);
    goto LAB_0015012f;
  case 0xee:
    interpretJumpOnTrue(this);
    goto LAB_0015012f;
  case 0xef:
    interpretJumpOnFalse(this);
    goto LAB_0015012f;
  case 0xf0:
    interpretPopStoreReceiverVariable(this);
    goto LAB_0015012f;
  case 0xf1:
    interpretPopStoreLiteralVariable(this);
    goto LAB_0015012f;
  case 0xf2:
    interpretPopStoreTemporalVariable(this);
    goto LAB_0015012f;
  case 0xf3:
    interpretStoreReceiverVariable(this);
    goto LAB_0015012f;
  case 0xf4:
    interpretStoreLiteralVariable(this);
    goto LAB_0015012f;
  case 0xf5:
    interpretStoreTemporalVariable(this);
    goto LAB_0015012f;
  case 0xf8:
    interpretCallPrimitive(this);
    goto LAB_0015012f;
  case 0xfa:
    interpretPushClosure(this);
    goto LAB_0015012f;
  case 0xfb:
    interpretPushTemporaryInVector(this);
    goto LAB_0015012f;
  case 0xfc:
    interpretStoreTemporalInVector(this);
    goto LAB_0015012f;
  case 0xfd:
    goto switchD_00150156_caseD_fd;
  }
  interpretPushLiteralShort(this,iVar2);
  goto LAB_0015012f;
switchD_00150156_caseD_fd:
  interpretPopStoreTemporalInVector(this);
  goto LAB_0015012f;
}

Assistant:

void StackInterpreter::interpret()
{
	// Reset the extensions values
	extendA = 0;
	extendB = 0;
    //printf("interpret begin %d\n", pc);
	while(pc != 0)
	{
		currentOpcode = nextOpcode;
        //printf("interpret %03d. %s\n", currentOpcode, getSistaBytecodeName(currentOpcode).c_str());
		switch(currentOpcode)
		{
#define BYTECODE_DISPATCH_NAME(name) interpret ## name
#include "BytecodeSetDispatchTable.inc"
#undef BYTECODE_DISPATCH_NAME

		default:
			errorFormat("unsupported bytecode %d", currentOpcode);
		}
	}
}